

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  size_t *psVar1;
  SymbolsByNameSet *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  pointer *ppRVar4;
  pointer *ppCVar5;
  byte bVar6;
  int iVar7;
  pointer pCVar8;
  _Hash_node_base *p_Var9;
  __buckets_ptr pp_Var10;
  _Hash_node_base *p_Var11;
  pointer pRVar12;
  Block *pBVar13;
  Block *pBVar14;
  char *str;
  LogMessage *pLVar15;
  pointer ppcVar16;
  char *pcVar17;
  __node_base_ptr p_Var18;
  __hash_code __code;
  char *pcVar19;
  ulong __bkt;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  pointer ppVar23;
  StringPiece SVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  pVar25;
  QueryKey name;
  key_type local_e8;
  StringPiece local_e0;
  Block *pBStack_d0;
  Block *pBStack_c8;
  Block *local_c0;
  Block *pBStack_b8;
  Block *local_b0;
  Block *pBStack_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x577);
    pLVar15 = internal::LogMessage::operator<<(&local_68,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar15);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pCVar8 = (this->checkpoints_).
           super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppcVar16 = (this->symbols_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar21 = (ulong)pCVar8[-1].pending_symbols_before_checkpoint;
  if (uVar21 < (ulong)((long)(this->symbols_after_checkpoint_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar16 >> 3)) {
    this_00 = &this->symbols_by_name_;
    p_Var2 = &(this->symbols_by_name_)._M_h._M_before_begin;
    do {
      local_e0.length_ = 0;
      pBStack_d0 = (Block *)0x0;
      stringpiece_internal::StringPiece::StringPiece((StringPiece *)&local_a0,ppcVar16[uVar21]);
      local_e0.length_ = local_a0._0_8_;
      pBStack_d0 = (Block *)local_a0.filename_;
      local_e0.ptr_ = (char *)CONCAT71(local_e0.ptr_._1_7_,10);
      local_e8.ptr_ = (SymbolBase *)&local_e0;
      local_a0._0_8_ = &local_e0;
      SVar24 = Symbol::full_name((Symbol *)&local_a0);
      pcVar17 = SVar24.ptr_;
      if ((long)SVar24.length_ < 1) {
        __code = 0;
      }
      else {
        pcVar19 = pcVar17 + SVar24.length_;
        __code = 0;
        do {
          __code = (long)*pcVar17 + __code * 5;
          pcVar17 = pcVar17 + 1;
        } while (pcVar17 < pcVar19);
      }
      __bkt = __code % (this->symbols_by_name_)._M_h._M_bucket_count;
      p_Var18 = std::
                _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::_M_find_before_node(&this_00->_M_h,__bkt,&local_e8,__code);
      if (p_Var18 != (__node_base_ptr)0x0) {
        p_Var9 = p_Var18->_M_nxt;
        pp_Var10 = (this_00->_M_h)._M_buckets;
        p_Var11 = p_Var9->_M_nxt;
        if (pp_Var10[__bkt] == p_Var18) {
          if (p_Var11 == (_Hash_node_base *)0x0) {
            uVar20 = 0;
          }
          else {
            uVar20 = (ulong)p_Var11[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count;
          }
          if (p_Var11 == (_Hash_node_base *)0x0 || uVar20 != __bkt) {
            if (p_Var11 != (_Hash_node_base *)0x0) {
              pp_Var10[uVar20] = pp_Var10[__bkt];
            }
            pp_Var10 = (this_00->_M_h)._M_buckets;
            if (p_Var2 == pp_Var10[__bkt]) {
              p_Var2->_M_nxt = p_Var11;
            }
            pp_Var10[__bkt] = (__node_base_ptr)0x0;
          }
        }
        else if ((p_Var11 != (_Hash_node_base *)0x0) &&
                (uVar20 = (ulong)p_Var11[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count,
                uVar20 != __bkt)) {
          pp_Var10[uVar20] = p_Var18;
        }
        p_Var18->_M_nxt = p_Var9->_M_nxt;
        operator_delete(p_Var9);
        psVar3 = &(this->symbols_by_name_)._M_h._M_element_count;
        *psVar3 = *psVar3 - 1;
      }
      uVar21 = uVar21 + 1;
      ppcVar16 = (this->symbols_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->symbols_after_checkpoint_).
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar16 >> 3)
            );
  }
  uVar21 = (ulong)pCVar8[-1].pending_files_before_checkpoint;
  ppcVar16 = (this->files_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar21 < (ulong)((long)(this->files_after_checkpoint_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar16 >> 3)) {
    do {
      stringpiece_internal::StringPiece::StringPiece(&local_e0,ppcVar16[uVar21]);
      std::
      _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->files_by_name_)._M_h,&local_e0);
      uVar21 = uVar21 + 1;
      ppcVar16 = (this->files_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->files_after_checkpoint_).
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar16 >> 3)
            );
  }
  uVar21 = (ulong)pCVar8[-1].pending_extensions_before_checkpoint;
  ppVar23 = (this->extensions_after_checkpoint_).
            super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (uVar21 < (ulong)((long)(this->extensions_after_checkpoint_).
                             super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar23 >> 4)) {
    lVar22 = uVar21 << 4;
    do {
      pVar25 = std::
               _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::equal_range(&(this->extensions_)._M_t,(key_type *)((long)&ppVar23->first + lVar22))
      ;
      std::
      _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::_M_erase_aux(&(this->extensions_)._M_t,(_Base_ptr)pVar25.first._M_node,
                     (_Base_ptr)pVar25.second._M_node);
      uVar21 = uVar21 + 1;
      ppVar23 = (this->extensions_after_checkpoint_).
                super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x10;
    } while (uVar21 < (ulong)((long)(this->extensions_after_checkpoint_).
                                    super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar23 >> 4)
            );
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->symbols_after_checkpoint_,(long)pCVar8[-1].pending_symbols_before_checkpoint);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->files_after_checkpoint_,(long)pCVar8[-1].pending_files_before_checkpoint);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::resize(&this->extensions_after_checkpoint_,(long)pCVar8[-1].pending_extensions_before_checkpoint
          );
  iVar7 = pCVar8[-1].arena_before_checkpoint;
  if ((ulong)(long)iVar7 < (this->arena_).num_allocations_) {
    do {
      if ((this->arena_).rollback_info_.
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->arena_).rollback_info_.
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x303);
        pLVar15 = internal::LogMessage::operator<<
                            (&local_a0,"CHECK failed: !rollback_info_.empty(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar15);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      pRVar12 = (this->arena_).rollback_info_.
                super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pBVar13 = pRVar12[-1].block;
      bVar6 = *(byte *)((long)&pBVar13[1].start_offset + (ulong)pBVar13->end_offset);
      if (bVar6 < 0x11) {
        (**(code **)((anonymous_namespace)::TableArena::
                     VisitAlloc<google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor,google::protobuf::(anonymous_namespace)::TableArena::OutOfLineAlloc,std::__cxx11::string,std::array<std::__cxx11::string,2ul>,std::array<std::__cxx11::string,3ul>,std::array<std::__cxx11::string,4ul>,std::array<std::__cxx11::string,5ul>,google::protobuf::FileDescriptorTables,google::protobuf::SourceCodeInfo,google::protobuf::FileOptions,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions>(char*,unsigned_short*,unsigned_short*,google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor,google::protobuf::(anonymous_namespace)::TableArena::TypeList<google::protobuf::(anonymous_namespace)::TableArena::OutOfLineAlloc,std::__cxx11::string,std::array<std::__cxx11::string,2ul>,std::array<std::__cxx11::string,3ul>,std::array<std::__cxx11::string,4ul>,std::array<std::__cxx11::string,5ul>,google::protobuf::FileDescriptorTables,google::protobuf::SourceCodeInfo,google::protobuf::FileOptions,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions>)
                     ::kFuncs + (ulong)(ushort)bVar6 * 8))(pBVar13 + 1,pBVar13);
      }
      else {
        pBVar13->start_offset = (ushort)bVar6 * -8 + pBVar13->start_offset + 0x80;
      }
      pBVar13->end_offset = pBVar13->end_offset + 1;
      psVar1 = &pRVar12[-1].count;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        ppRVar4 = &(this->arena_).rollback_info_.
                   super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar4 = *ppRVar4 + -1;
      }
      uVar21 = (this->arena_).num_allocations_ - 1;
      (this->arena_).num_allocations_ = uVar21;
    } while ((ulong)(long)iVar7 < uVar21);
  }
  local_e0.ptr_ = (char *)(this->arena_).current_;
  local_e0.length_ = (size_type)(this->arena_).full_blocks_;
  pBStack_d0 = (this->arena_).small_size_blocks_._M_elems[0];
  pBStack_c8 = (this->arena_).small_size_blocks_._M_elems[1];
  local_c0 = (this->arena_).small_size_blocks_._M_elems[2];
  pBStack_b8 = (this->arena_).small_size_blocks_._M_elems[3];
  local_b0 = (this->arena_).small_size_blocks_._M_elems[4];
  pBStack_a8 = (this->arena_).small_size_blocks_._M_elems[5];
  (this->arena_).small_size_blocks_._M_elems[5] = (Block *)0x0;
  (this->arena_).full_blocks_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[3] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[4] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[1] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[2] = (Block *)0x0;
  (this->arena_).current_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[0] = (Block *)0x0;
  lVar22 = 0;
  do {
    pBVar13 = *(Block **)((long)&local_e0.ptr_ + lVar22);
    while (pBVar13 != (Block *)0x0) {
      pBVar14 = pBVar13->next;
      if (pBVar13->start_offset == 0) {
        operator_delete(pBVar13);
        pBVar13 = pBVar14;
      }
      else {
        anon_unknown_1::TableArena::RelocateToUsedList(&this->arena_,pBVar13);
        pBVar13 = pBVar14;
      }
    }
    lVar22 = lVar22 + 8;
  } while (lVar22 != 0x40);
  ppCVar5 = &(this->checkpoints_).
             super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar5 = *ppCVar5 + -1;
  return;
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (size_t i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size(); i++) {
    Symbol::QueryKey name;
    name.name = symbols_after_checkpoint_[i];
    symbols_by_name_.erase(Symbol(&name));
  }
  for (size_t i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size(); i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (size_t i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size(); i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  arena_.RollbackTo(checkpoint.arena_before_checkpoint);
  checkpoints_.pop_back();
}